

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::moveBlock(Board *this,int index,int direction)

{
  pointer pBVar1;
  pointer pBVar2;
  Block block;
  Block block_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  pBVar2 = (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = pBVar2 + index;
  uVar3 = pBVar1->id;
  uVar4 = pBVar1->row;
  uVar5 = pBVar1->column;
  uVar6 = pBVar1->length;
  block.length = uVar6;
  block.column = uVar5;
  block.row = uVar4;
  block.id = uVar3;
  block.direction = pBVar2[index].direction;
  insert(this,block,0);
  Block::move((this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
              super__Vector_impl_data._M_start + index,direction);
  pBVar2 = (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = pBVar2 + index;
  uVar7 = pBVar1->id;
  uVar8 = pBVar1->row;
  uVar9 = pBVar1->column;
  uVar10 = pBVar1->length;
  block_00.length = uVar10;
  block_00.column = uVar9;
  block_00.row = uVar8;
  block_00.id = uVar7;
  block_00.direction = pBVar2[index].direction;
  insert(this,block_00,-1);
  return;
}

Assistant:

void Board::moveBlock(int index, int direction) {
    // Remove the block.
    this->insert(this->blocks[index], 0);

    // Move the block.
    this->blocks[index].move(direction);

    // Insert the moved block back to the board.
    this->insert(this->blocks[index]);
}